

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

void setup_frame_info(AV1Decoder *pbi)

{
  int iVar1;
  int iVar2;
  ThreadData_conflict *in_RDI;
  AV1_COMMON *unaff_retaddr;
  int buf_size;
  int use_highbd;
  int p;
  AV1_COMMON *cm;
  int in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  undefined4 in_stack_ffffffffffffffe8;
  AV1_COMMON *cm_00;
  
  cm_00 = (AV1_COMMON *)&in_RDI->cb_buffer_base;
  if ((((in_RDI->cb_buffer_base).dqcoeff[0][0x1688] != 0) ||
      ((in_RDI->cb_buffer_base).dqcoeff[0][0x1698] != 0)) ||
     ((in_RDI->cb_buffer_base).dqcoeff[0][0x16a8] != 0)) {
    av1_alloc_restoration_buffers((AV1_COMMON *)pbi,cm._7_1_);
    in_stack_ffffffffffffffe0 = 0;
    while (iVar2 = in_stack_ffffffffffffffe0, iVar1 = av1_num_planes(cm_00),
          in_stack_ffffffffffffffe0 < iVar1) {
      av1_alloc_restoration_struct
                (cm_00,(RestorationInfo *)CONCAT44(iVar2,in_stack_ffffffffffffffe8),
                 in_stack_ffffffffffffffe4);
      in_stack_ffffffffffffffe0 = iVar2 + 1;
    }
  }
  iVar2 = 0x11040 << (cm_00->seq_params->use_highbitdepth & 0x1f);
  if (in_RDI[1].cb_buffer_base.dqcoeff[0][0x1960] != iVar2) {
    av1_free_mc_tmp_buf((ThreadData_conflict *)CONCAT44(iVar2,in_stack_ffffffffffffffe0));
    allocate_mc_tmp_buf(unaff_retaddr,in_RDI,(int)((ulong)cm_00 >> 0x20),(int)cm_00);
  }
  return;
}

Assistant:

static inline void setup_frame_info(AV1Decoder *pbi) {
  AV1_COMMON *const cm = &pbi->common;

  if (cm->rst_info[0].frame_restoration_type != RESTORE_NONE ||
      cm->rst_info[1].frame_restoration_type != RESTORE_NONE ||
      cm->rst_info[2].frame_restoration_type != RESTORE_NONE) {
    av1_alloc_restoration_buffers(cm, /*is_sgr_enabled =*/true);
    for (int p = 0; p < av1_num_planes(cm); p++) {
      av1_alloc_restoration_struct(cm, &cm->rst_info[p], p > 0);
    }
  }

  const int use_highbd = cm->seq_params->use_highbitdepth;
  const int buf_size = MC_TEMP_BUF_PELS << use_highbd;
  if (pbi->td.mc_buf_size != buf_size) {
    av1_free_mc_tmp_buf(&pbi->td);
    allocate_mc_tmp_buf(cm, &pbi->td, buf_size, use_highbd);
  }
}